

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

void extract_min_heap(U32Pair *min_heap,u32 last_index)

{
  U32Pair UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  *min_heap = min_heap[last_index];
  uVar2 = 0;
  while( true ) {
    uVar3 = uVar2 * 2 + 1;
    if (last_index <= uVar3) {
      return;
    }
    if (min_heap[uVar2].count <= min_heap[uVar3].count) {
      uVar3 = uVar2;
    }
    uVar5 = uVar2 * 2 + 2;
    uVar4 = uVar3;
    if ((uVar5 < last_index) && (uVar4 = uVar5, min_heap[uVar3].count <= min_heap[uVar5].count)) {
      uVar4 = uVar3;
    }
    if (uVar4 == uVar2) break;
    UVar1 = min_heap[uVar4];
    min_heap[uVar4] = min_heap[uVar2];
    min_heap[uVar2] = UVar1;
    uVar2 = uVar4;
  }
  return;
}

Assistant:

void extract_min_heap(U32Pair* min_heap, u32 last_index) {
  min_heap[0] = min_heap[last_index];
  u32 index = 0;
  while (index * 2 + 1 < last_index) {
    u32 left_index = index * 2 + 1, right_index = index * 2 + 2;
    u32 min_index = index;
    if (left_index < last_index &&
        min_heap[min_index].count > min_heap[left_index].count) {
      min_index = left_index;
    }
    if (right_index < last_index &&
        min_heap[min_index].count > min_heap[right_index].count) {
      min_index = right_index;
    }
    if (min_index == index) {
      break;
    }
    swap_pair(&min_heap[min_index], &min_heap[index]);
    index = min_index;
  }
}